

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O0

void __thiscall
ctemplate::TemplateDictionary::SetEscapedValue
          (TemplateDictionary *this,TemplateString variable,TemplateString value,
          TemplateModifier *escfn)

{
  TemplateString variable_00;
  TemplateString value_00;
  char *inlen;
  string *arg;
  allocator local_99;
  string local_98 [32];
  TemplateModifier local_78 [4];
  TemplateString local_58;
  char *local_38;
  size_t sStack_30;
  bool local_28;
  undefined7 uStack_27;
  TemplateId TStack_20;
  TemplateModifier *local_18;
  TemplateModifier *escfn_local;
  TemplateDictionary *this_local;
  
  local_28 = variable.is_immutable_;
  uStack_27 = variable._17_7_;
  TStack_20 = variable.id_;
  local_38 = variable.ptr_;
  sStack_30 = variable.length_;
  local_18 = escfn;
  escfn_local = (TemplateModifier *)this;
  inlen = TemplateString::data(&value);
  arg = (string *)TemplateString::size(&value);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"",&local_99);
  TemplateModifier::operator()(local_78,(char *)escfn,(size_t)inlen,arg);
  TemplateString::TemplateString(&local_58,(string *)local_78);
  variable_00.length_ = sStack_30;
  variable_00.ptr_ = local_38;
  variable_00.is_immutable_ = local_28;
  variable_00._17_7_ = uStack_27;
  variable_00.id_ = TStack_20;
  value_00.length_ = local_58.length_;
  value_00.ptr_ = local_58.ptr_;
  value_00.is_immutable_ = local_58.is_immutable_;
  value_00._17_7_ = local_58._17_7_;
  value_00.id_ = local_58.id_;
  SetValue(this,variable_00,value_00);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  return;
}

Assistant:

void TemplateDictionary::SetEscapedValue(TemplateString variable,
                                         TemplateString value,
                                         const TemplateModifier& escfn) {
  SetValue(variable, string(escfn(value.data(), value.size())));
}